

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

fio_str_info_s * fiobj_obj2cstr(fio_str_info_s *__return_storage_ptr__,FIOBJ o)

{
  fiobj_object_vtable_s *pfVar1;
  fio_str_info_s *ret;
  char local_10;
  FIOBJ o_local;
  
  if (o == 0) {
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = 4;
    __return_storage_ptr__->data = "null";
  }
  else if ((o & 1) == 0) {
    if ((o & 6) == 6) {
      local_10 = (char)o;
      if (local_10 == '\x06') {
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = 4;
        __return_storage_ptr__->data = "null";
        return __return_storage_ptr__;
      }
      if (local_10 == '\x16') {
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = 4;
        __return_storage_ptr__->data = "true";
        return __return_storage_ptr__;
      }
      if (local_10 == '&') {
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = 5;
        __return_storage_ptr__->data = "false";
        return __return_storage_ptr__;
      }
    }
    pfVar1 = fiobj_type_vtable(o);
    (*pfVar1->to_str)(__return_storage_ptr__,o);
  }
  else {
    fio_ltocstr(__return_storage_ptr__,(long)o >> 1);
  }
  return __return_storage_ptr__;
}

Assistant:

void __attribute__((format(printf, 1, 0), weak))
FIO_LOG2STDERR(const char *format, ...) {
  char tmp___log[FIO_LOG____LENGTH_ON_STACK];
  va_list argv;
  va_start(argv, format);
  int len___log = vsnprintf(tmp___log, FIO_LOG_LENGTH_LIMIT - 2, format, argv);
  va_end(argv);
  if (len___log <= 0 || len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
    if (len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
      memcpy(tmp___log + FIO_LOG____LENGTH_BORDER, "... (warning: truncated).",
             25);
      len___log = FIO_LOG____LENGTH_BORDER + 25;
    } else {
      fwrite("ERROR: log output error (can't write).\n", 39, 1, stderr);
      return;
    }
  }
  tmp___log[len___log++] = '\n';
  tmp___log[len___log] = '0';
  fwrite(tmp___log, len___log, 1, stderr);
}